

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::GetStringDefaultValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  ulong uVar1;
  string *input;
  unsigned_long u64;
  AlphaNum *a;
  AlphaNum local_108;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator local_21;
  FieldDescriptor *local_20;
  FieldDescriptor *descriptor_local;
  FieldGeneratorBase *this_local;
  
  local_20 = descriptor;
  descriptor_local = (FieldDescriptor *)this;
  this_local = (FieldGeneratorBase *)__return_storage_ptr__;
  FieldDescriptor::default_value_string_abi_cxx11_(descriptor);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    input = FieldDescriptor::default_value_string_abi_cxx11_(local_20);
    StringToBase64(&local_b8,input);
    std::operator+(&local_98,
                   "global::System.Text.Encoding.UTF8.GetString(global::System.Convert.FromBase64String(\""
                   ,&local_b8);
    std::operator+(&local_78,&local_98,"\"), 0, ");
    FieldDescriptor::default_value_string_abi_cxx11_(local_20);
    u64 = std::__cxx11::string::length();
    strings::AlphaNum::AlphaNum(&local_108,u64);
    StrCat_abi_cxx11_(&local_d8,(protobuf *)&local_108,a);
    std::operator+(&local_58,&local_78,&local_d8);
    std::operator+(__return_storage_ptr__,&local_58,")");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\"\"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::GetStringDefaultValueInternal(const FieldDescriptor* descriptor) {
    if (descriptor->default_value_string().empty())
        return "\"\"";
    else
      return "global::System.Text.Encoding.UTF8.GetString(global::System."
             "Convert.FromBase64String(\"" +
             StringToBase64(descriptor->default_value_string()) + "\"), 0, " + StrCat(descriptor->default_value_string().length()) + ")";
}